

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O3

slReturn ubxSetNMEAData(int fdPort,int verbosity,_Bool nmeaOn)

{
  ubxMsg pollMsg;
  ubxMsg msg;
  ubxMsg msg_00;
  ubxMsg msg_01;
  _Bool _Var1;
  ubxChecksum uVar2;
  uint16_t uVar3;
  slReturn pvVar4;
  void *pvVar5;
  slBuffer *psVar6;
  uint64_t uVar7;
  char *pcVar8;
  undefined7 in_register_00000011;
  char *msg_02;
  ubxMsg result_1;
  ubxMsg poll;
  ubxMsg current;
  undefined2 in_stack_ffffffffffffff70;
  undefined2 uVar9;
  undefined6 in_stack_ffffffffffffff72;
  undefined8 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff80;
  undefined6 in_stack_ffffffffffffff82;
  undefined6 uStack_76;
  undefined6 uStack_66;
  ubxMsg local_60;
  errorInfo_slReturn local_48;
  
  msg_02 = "off";
  if ((int)CONCAT71(in_register_00000011,nmeaOn) != 0) {
    msg_02 = "on";
  }
  if (2 < verbosity) {
    printf("Querying to see if GPS UART already has NMEA data turned %s...\n",msg_02);
  }
  pvVar4 = isNmeaOn(fdPort);
  _Var1 = isErrorReturn(pvVar4);
  if (!_Var1) {
    pvVar5 = getReturnInfo(pvVar4);
    if ((pvVar5 == (void *)0x0) != nmeaOn) {
      if (2 < verbosity) {
        printf("GPS UART already has NMEA data turned %s...\n",msg_02);
      }
      pvVar4 = makeOkReturn();
      return pvVar4;
    }
    if (2 < verbosity) {
      puts("Polling GPS UART configuration...");
    }
    psVar6 = init_slBuffer_int(1,LittleEndian,1);
    msg_00._2_6_ = in_stack_ffffffffffffff72;
    msg_00.type.class = (char)in_stack_ffffffffffffff70;
    msg_00.type.id = (char)((ushort)in_stack_ffffffffffffff70 >> 8);
    msg_00.body = (slBuffer *)in_stack_ffffffffffffff78;
    msg_00.checksum.ck_a = (char)in_stack_ffffffffffffff80;
    msg_00.checksum.ck_b = (char)((ushort)in_stack_ffffffffffffff80 >> 8);
    msg_00._18_6_ = in_stack_ffffffffffffff82;
    uVar2 = calcFletcherChecksum(msg_00);
    pollMsg._4_4_ = (int)((uint6)uStack_76 >> 0x10);
    pollMsg._0_4_ = (int)CONCAT62(uStack_76,6);
    pollMsg.body._0_4_ = (int)psVar6;
    pollMsg.body._4_4_ = (int)((ulong)psVar6 >> 0x20);
    pollMsg._16_4_ = (int)CONCAT62(uStack_66,uVar2);
    pollMsg._20_4_ = (int)((uint6)uStack_66 >> 0x10);
    pvVar4 = pollUbx(fdPort,pollMsg,1000,&local_60);
    _Var1 = isErrorReturn(pvVar4);
    if (!_Var1) {
      uVar3 = get_uint16_slBuffer(local_60.body,0xe);
      uVar7 = setBit_slBits((ulong)uVar3,1,nmeaOn);
      put_uint16_slBuffer(local_60.body,0xe,(uint16_t)uVar7);
      if (2 < verbosity) {
        printf("Sending new configuration to GPS with NMEA data turned %s for the UART...\n",msg_02)
        ;
      }
      uVar9 = 6;
      msg_01._2_6_ = in_stack_ffffffffffffff72;
      msg_01.type.class = '\x06';
      msg_01.type.id = '\0';
      msg_01.body = local_60.body;
      msg_01.checksum.ck_a = (char)in_stack_ffffffffffffff80;
      msg_01.checksum.ck_b = (char)((ushort)in_stack_ffffffffffffff80 >> 8);
      msg_01._18_6_ = in_stack_ffffffffffffff82;
      uVar2 = calcFletcherChecksum(msg_01);
      msg._4_4_ = (int)((uint6)in_stack_ffffffffffffff72 >> 0x10);
      msg._0_4_ = (int)CONCAT62(in_stack_ffffffffffffff72,uVar9);
      msg.body._0_4_ = (int)local_60.body;
      msg.body._4_4_ = (int)((ulong)local_60.body >> 0x20);
      msg._16_4_ = (int)CONCAT62(in_stack_ffffffffffffff82,uVar2);
      msg._20_4_ = (int)((uint6)in_stack_ffffffffffffff82 >> 0x10);
      pvVar4 = sendUbxAckedMsg(fdPort,msg);
      _Var1 = isOkReturn(pvVar4);
      if (_Var1) {
        if (0 < verbosity) {
          printf("Successfully set new configuration to turn NMEA data %s for GPS UART...\n",msg_02)
          ;
        }
        pvVar4 = makeOkReturn();
      }
      else {
        if (0 < verbosity) {
          printf("Failed to change GPS UART configuration to turn NMEA data %s...\n",msg_02);
        }
        createErrorInfo(&local_48,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c"
                        ,"ubxSetNMEAData",0x4de,pvVar4);
        pcVar8 = getReturnMsg(pvVar4);
        pvVar4 = makeErrorFmtMsgReturn(0x1151ea,msg_02,pcVar8);
      }
    }
  }
  return pvVar4;
}

Assistant:

extern slReturn ubxSetNMEAData(int fdPort, int verbosity, bool nmeaOn) {

    char* onoff = nmeaOn ? "on" : "off";

    // first we poll for the current configuration...
    if (verbosity >= 3) printf("Querying to see if GPS UART already has NMEA data turned %s...\n", onoff);
    slReturn cn = isNmeaOn(fdPort);
    if (isErrorReturn(cn)) return cn;

    // extract our state information...
    bool currentState = getReturnInfoBool(cn);

    // if we're already in the state we want, just leave...
    if (currentState == nmeaOn) {
        if (verbosity >= 3) printf("GPS UART already has NMEA data turned %s...\n", onoff);
        return makeOkReturn();
    }

    // change the configuration to the way we want it, starting with polling it again...
    if (verbosity >= 3) printf("Polling GPS UART configuration...\n");
    ubxMsg poll = createUbxMsg(ut_CFG_PRT, init_slBuffer(LittleEndian, 1));  // UART is index 1; defines won't work here...
    ubxMsg current;
    slReturn resp = pollUbx(fdPort, poll, CFG_PRT_MAX_MS, &current);
    if (isErrorReturn(resp)) return resp;

    // now change the bit we need to diddle...
    slBuffer *bdy = current.body;
    put_uint16_slBuffer(bdy, 14, (uint16_t) setBit_slBits(get_uint16_slBuffer(bdy, 14), 1, nmeaOn));

    // send out the message to actually make the change...
    if (verbosity >= 3) printf("Sending new configuration to GPS with NMEA data turned %s for the UART...\n", onoff);
    slReturn ackResp = sendUbxAckedMsg(fdPort, createUbxMsg(ut_CFG_PRT, bdy));
    if (isOkReturn(ackResp)) {
        if (verbosity >= 1) printf("Successfully set new configuration to turn NMEA data %s for GPS UART...\n", onoff);
        return makeOkReturn();
    }
    else {
        if (verbosity >= 1) printf("Failed to change GPS UART configuration to turn NMEA data %s...\n", onoff);
        return makeErrorFmtMsgReturn(ERR_CAUSE(ackResp), "failed to change GPS UART configuration to turn NMEA data %s: %s", onoff, getReturnMsg(ackResp));
    }
}